

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O1

IOTHUB_MESSAGE_RESULT
IoTHubMessage_SetContentTypeSystemProperty
          (IOTHUB_MESSAGE_HANDLE iotHubMessageHandle,char *contentType)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_MESSAGE_RESULT IVar3;
  
  if (iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0 || contentType == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      IVar3 = IOTHUB_MESSAGE_INVALID_ARG;
    }
    else {
      IVar3 = IOTHUB_MESSAGE_INVALID_ARG;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"IoTHubMessage_SetContentTypeSystemProperty",0x2b1,1,
                "Invalid argument (iotHubMessageHandle=%p, contentType=%p)",iotHubMessageHandle,
                contentType);
    }
  }
  else {
    if (iotHubMessageHandle->userDefinedContentType != (char *)0x0) {
      free(iotHubMessageHandle->userDefinedContentType);
      iotHubMessageHandle->userDefinedContentType = (char *)0x0;
    }
    iVar1 = mallocAndStrcpy_s(&iotHubMessageHandle->userDefinedContentType,contentType);
    if (iVar1 == 0) {
      IVar3 = IOTHUB_MESSAGE_OK;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      IVar3 = IOTHUB_MESSAGE_ERROR;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                  ,"IoTHubMessage_SetContentTypeSystemProperty",0x2c0,1,
                  "Failed saving a copy of contentType");
      }
    }
  }
  return IVar3;
}

Assistant:

IOTHUB_MESSAGE_RESULT IoTHubMessage_SetContentTypeSystemProperty(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle, const char* contentType)
{
    IOTHUB_MESSAGE_RESULT result;

    if (iotHubMessageHandle == NULL || contentType == NULL)
    {
        LogError("Invalid argument (iotHubMessageHandle=%p, contentType=%p)", iotHubMessageHandle, contentType);
        result = IOTHUB_MESSAGE_INVALID_ARG;
    }
    else
    {
        IOTHUB_MESSAGE_HANDLE_DATA* handleData = (IOTHUB_MESSAGE_HANDLE_DATA*)iotHubMessageHandle;

        if (handleData->userDefinedContentType != NULL)
        {
            free(handleData->userDefinedContentType);
            handleData->userDefinedContentType = NULL;
        }

        if (mallocAndStrcpy_s(&handleData->userDefinedContentType, contentType) != 0)
        {
            LogError("Failed saving a copy of contentType");
            result = IOTHUB_MESSAGE_ERROR;
        }
        else
        {
            result = IOTHUB_MESSAGE_OK;
        }
    }

    return result;
}